

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::PeekIsCustom(WastParser *this)

{
  bool bVar1;
  TokenTypePair TVar2;
  Token *this_00;
  string_view __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  
  if (this->options_[0xb] == (WastParseOptions)0x1) {
    TVar2 = PeekPair(this);
    if (TVar2._M_elems[0] == LparAnn) {
      this_00 = TokenQueue::front(&this->tokens_);
      __x = Token::text(this_00);
      __y._M_str = "custom";
      __y._M_len = 6;
      bVar1 = std::operator==(__x,__y);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool WastParser::PeekIsCustom() {
  // If IsLparAnn succeeds, tokens_.front() must have text, as it is an LparAnn
  // token.
  return options_->features.annotations_enabled() && IsLparAnn(PeekPair()) &&
         tokens_.front().text() == "custom";
}